

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

_Bool oonf_layer2_net_remove(oonf_layer2_net *l2net,oonf_layer2_origin *origin)

{
  char *pcVar1;
  list_entity *plVar2;
  byte bVar3;
  byte bVar4;
  _Bool _Var5;
  bool bVar6;
  long lVar7;
  list_entity *plVar8;
  
  if ((l2net->_node).list.next == (list_entity *)0x0) {
    bVar6 = false;
  }
  else if ((l2net->_node).list.prev == (list_entity *)0x0) {
    bVar6 = false;
  }
  else {
    plVar8 = (l2net->neighbors).list_head.next;
    if (plVar8->prev == (l2net->neighbors).list_head.prev) {
      bVar3 = 0;
    }
    else {
      bVar3 = 0;
      do {
        plVar2 = plVar8->next;
        _Var5 = oonf_layer2_neigh_remove((oonf_layer2_neigh *)(plVar8 + -0x4c),origin);
        if (_Var5) {
          bVar3 = 1;
        }
        plVar8 = plVar2;
      } while (plVar2->prev != (l2net->neighbors).list_head.prev);
    }
    lVar7 = 0x130;
    bVar4 = 0;
    do {
      if (*(oonf_layer2_origin **)(l2net->name + lVar7) == origin) {
        pcVar1 = l2net->name + lVar7 + -8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        bVar4 = 1;
      }
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0x3b0);
    lVar7 = 0x3b0;
    do {
      if (*(oonf_layer2_origin **)(l2net->name + lVar7) == origin) {
        pcVar1 = l2net->name + lVar7 + -8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        bVar4 = 1;
      }
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0x7c0);
    bVar6 = (bool)(bVar4 | bVar3);
    if (bVar6) {
      oonf_layer2_net_commit(l2net);
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

static INLINE bool
list_is_node_added(const struct list_entity *node) {
  return node->next != NULL && node->prev != NULL;
}